

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

void bov_points_draw_aux(bov_window_t *window,bov_points_t *points,bov_points_drawing_mode_t mode,
                        GLint start,GLsizei count)

{
  int iVar1;
  int iVar2;
  GLenum GVar3;
  
  iVar1 = points->vboLen;
  iVar2 = iVar1 - start;
  if (iVar2 != 0 && start <= iVar1) {
    if (iVar1 < count + start) {
      count = iVar2;
    }
    if (start < 0) {
      count = iVar2;
    }
    GVar3 = switch_rasterizer_with_mode(window,points,mode);
    (*glad_glDrawArrays)(GVar3,start,count);
    return;
  }
  return;
}

Assistant:

void bov_points_draw_aux(bov_window_t* window,
                         const bov_points_t* points,
                         bov_points_drawing_mode_t mode,
                         GLint start,
                         GLsizei count)
{
	if(start>=points->vboLen)
		return;

	if(count + start > points->vboLen || start + count < count) { //< don't forget to detect overflow
		count = points->vboLen - start;
	}

	GLenum primitive = switch_rasterizer_with_mode(window, points, mode);
	glDrawArrays(primitive, start, count);
	// glBindVertexArray(0);
}